

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hdr_histogram_test.c
# Opt level: O0

char * test_get_max_value(void)

{
  _Bool _Var1;
  int64_t iVar2;
  int64_t actual_cor_max;
  int64_t actual_raw_max;
  
  load_histograms();
  iVar2 = hdr_max(raw_histogram);
  _Var1 = hdr_values_are_equivalent(raw_histogram,iVar2,100000000);
  if (_Var1) {
    iVar2 = hdr_max(cor_histogram);
    _Var1 = hdr_values_are_equivalent(cor_histogram,iVar2,100000000);
    if (_Var1) {
      actual_raw_max = 0;
    }
    else {
      actual_raw_max = (int64_t)anon_var_dwarf_3b1;
    }
  }
  else {
    actual_raw_max = (int64_t)anon_var_dwarf_39b;
  }
  return (char *)actual_raw_max;
}

Assistant:

static char* test_get_max_value(void)
{
    int64_t actual_raw_max, actual_cor_max;

    load_histograms();

    actual_raw_max = hdr_max(raw_histogram);
    mu_assert("hdr_max(raw_histogram) != 100000000L",
              hdr_values_are_equivalent(raw_histogram, actual_raw_max, 100000000));
    actual_cor_max = hdr_max(cor_histogram);
    mu_assert("hdr_max(cor_histogram) != 100000000L",
              hdr_values_are_equivalent(cor_histogram, actual_cor_max, 100000000));

    return 0;
}